

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O2

void anon_unknown.dwarf_cd2a3::writeDString(uint8_t *buffer,char *value,size_t fieldLen)

{
  ulong uVar1;
  char cVar2;
  short sVar3;
  byte *pbVar4;
  byte bVar5;
  char cVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  uint8_t contentLength;
  vector<unsigned_char,_std::allocator<unsigned_char>_> content;
  int local_80;
  value_type_conflict1 local_7a;
  allocator<char> local_79;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  byte *local_60;
  long local_58;
  uint8_t *local_40;
  size_t local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,value,&local_79);
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (local_58 == 0) goto LAB_001a1104;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,fieldLen);
  uVar1 = fieldLen - 1;
  pbVar4 = local_60;
  do {
    local_40 = buffer;
    local_38 = fieldLen;
    if (pbVar4 == local_60 + local_58) {
      local_80 = CONCAT31(local_80._1_3_,8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,
                 (uchar *)&local_80);
      pbVar4 = local_60;
      goto LAB_001a1045;
    }
    bVar7 = *pbVar4;
    uVar9 = (uint)bVar7;
    bVar5 = convertUTF::trailingBytesForUTF8[bVar7];
    iVar8 = 0;
    switch(bVar5) {
    case 0:
      uVar9 = (uint)bVar5;
      break;
    case 5:
      iVar8 = (uint)bVar7 << 6;
      uVar9 = (uint)pbVar4[1];
      pbVar4 = pbVar4 + 1;
    case 4:
      iVar8 = (uVar9 + iVar8) * 0x40;
      uVar9 = (uint)pbVar4[1];
      pbVar4 = pbVar4 + 1;
    case 3:
      iVar8 = (uVar9 + iVar8) * 0x40;
      uVar9 = (uint)pbVar4[1];
      pbVar4 = pbVar4 + 1;
    case 2:
      iVar8 = (uVar9 + iVar8) * 0x40;
      uVar9 = (uint)pbVar4[1];
      pbVar4 = pbVar4 + 1;
    case 1:
      uVar9 = (uVar9 + iVar8) * 0x40;
      bVar7 = pbVar4[1];
      pbVar4 = pbVar4 + 1;
      break;
    default:
      goto switchD_001a0e39_default;
    }
    pbVar4 = pbVar4 + 1;
    iVar8 = bVar7 + uVar9;
switchD_001a0e39_default:
  } while ((uint)(iVar8 - *(int *)(convertUTF::offsetsFromUTF8 +
                                  (ulong)(ushort)(short)(char)bVar5 * 4)) < 0x100);
  local_80 = CONCAT31(local_80._1_3_,0x10);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,(uchar *)&local_80);
  pbVar4 = local_60;
  while (pbVar4 != local_60 + local_58) {
    bVar7 = *pbVar4;
    uVar9 = (uint)bVar7;
    bVar5 = convertUTF::trailingBytesForUTF8[bVar7];
    iVar8 = 0;
    switch(bVar5) {
    case 0:
      uVar9 = (uint)bVar5;
      break;
    case 5:
      iVar8 = (uint)bVar7 << 6;
      uVar9 = (uint)pbVar4[1];
      pbVar4 = pbVar4 + 1;
    case 4:
      iVar8 = (uVar9 + iVar8) * 0x40;
      uVar9 = (uint)pbVar4[1];
      pbVar4 = pbVar4 + 1;
    case 3:
      iVar8 = (uVar9 + iVar8) * 0x40;
      uVar9 = (uint)pbVar4[1];
      pbVar4 = pbVar4 + 1;
    case 2:
      iVar8 = (uVar9 + iVar8) * 0x40;
      uVar9 = (uint)pbVar4[1];
      pbVar4 = pbVar4 + 1;
    case 1:
      uVar9 = (uVar9 + iVar8) * 0x40;
      bVar7 = pbVar4[1];
      pbVar4 = pbVar4 + 1;
      break;
    default:
      goto switchD_001a0f24_default;
    }
    pbVar4 = pbVar4 + 1;
    iVar8 = bVar7 + uVar9;
switchD_001a0f24_default:
    convertUTF::ConvertUTF32toUTF16
              ((convertUTF *)&local_80,
               iVar8 - *(int *)(convertUTF::offsetsFromUTF8 + (ulong)(ushort)(short)(char)bVar5 * 4)
              );
    iVar8 = local_80;
    if ((local_78._M_impl.super__Vector_impl_data._M_start +
         (uVar1 - (long)local_78._M_impl.super__Vector_impl_data._M_finish) < (pointer)0x2) ||
       ((sVar3 = (short)local_80, (short)local_80 != 0 &&
        (local_78._M_impl.super__Vector_impl_data._M_start +
         (uVar1 - (long)local_78._M_impl.super__Vector_impl_data._M_finish) < (pointer)0x4))))
    break;
    local_80._0_1_ = SUB41((uint)local_80 >> 0x18,0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,(uchar *)&local_80
              );
    local_80 = CONCAT31(local_80._1_3_,(char)((uint)iVar8 >> 0x10));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,(uchar *)&local_80
              );
    if (sVar3 != 0) {
      local_80._0_1_ = SUB41((uint)iVar8 >> 8,0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,
                 (uchar *)&local_80);
      local_80 = CONCAT31(local_80._1_3_,(char)iVar8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,
                 (uchar *)&local_80);
    }
  }
  goto LAB_001a10c8;
LAB_001a1045:
  do {
    if (pbVar4 == local_60 + local_58) break;
    bVar5 = *pbVar4;
    cVar2 = convertUTF::trailingBytesForUTF8[bVar5];
    switch(cVar2) {
    case '\0':
      cVar6 = cVar2;
      break;
    case '\x05':
      pbVar4 = pbVar4 + 1;
    case '\x04':
      pbVar4 = pbVar4 + 1;
    case '\x03':
      pbVar4 = pbVar4 + 1;
    case '\x02':
      bVar5 = pbVar4[1];
      pbVar4 = pbVar4 + 1;
    case '\x01':
      cVar6 = bVar5 << 6;
      bVar5 = pbVar4[1];
      pbVar4 = pbVar4 + 1;
      break;
    default:
      cVar6 = '\0';
      goto LAB_001a1099;
    }
    pbVar4 = pbVar4 + 1;
    cVar6 = bVar5 + cVar6;
LAB_001a1099:
    local_80 = CONCAT31(local_80._1_3_,
                        cVar6 - (char)*(undefined4 *)
                                       (convertUTF::offsetsFromUTF8 +
                                       (ulong)(ushort)(short)cVar2 * 4));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,
               (value_type_conflict1 *)&local_80);
  } while ((ulong)((long)local_78._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_78._M_impl.super__Vector_impl_data._M_start) < uVar1);
LAB_001a10c8:
  local_7a = (value_type_conflict1)
             ((long)local_78._M_impl.super__Vector_impl_data._M_finish -
             (long)local_78._M_impl.super__Vector_impl_data._M_start);
  local_80 = 0;
  std::
  __fill_n_a1<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_long,int>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,
             uVar1 - ((long)local_78._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_78._M_impl.super__Vector_impl_data._M_start),&local_80);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,&local_7a);
  fieldLen = local_38;
  buffer = local_40;
LAB_001a1104:
  std::__cxx11::string::~string((string *)&local_60);
  if ((long)local_78._M_impl.super__Vector_impl_data._M_finish -
      (long)local_78._M_impl.super__Vector_impl_data._M_start != fieldLen) {
    __assert_fail("content.size() == fieldLen",
                  "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/iso_writer.cpp"
                  ,0xb6,
                  "void (anonymous namespace)::writeDString(uint8_t *, const char *, const size_t)")
    ;
  }
  if (local_78._M_impl.super__Vector_impl_data._M_finish !=
      local_78._M_impl.super__Vector_impl_data._M_start) {
    memmove(buffer,local_78._M_impl.super__Vector_impl_data._M_start,fieldLen);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_78);
  return;
}

Assistant:

void writeDString(uint8_t *buffer, const char *value, const size_t fieldLen)
{
    auto content = serializeDString(value, fieldLen);
    assert(content.size() == fieldLen);
    std::copy(std::begin(content), std::end(content), buffer);
}